

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O0

uint32_t __thiscall
asmjit::v1_14::RALocalAllocator::decideOnReassignment
          (RALocalAllocator *this,RegGroup group,uint32_t workId,uint32_t physId,
          RegMask allocableRegs,RAInst *raInst)

{
  RAWorkReg *pRVar1;
  uint32_t uVar2;
  bool bVar3;
  uint uVar4;
  RAWorkReg **ppRVar5;
  RATiedReg *pRVar6;
  undefined4 in_ECX;
  RegGroup group_00;
  undefined4 in_EDX;
  undefined1 in_SIL;
  undefined8 *in_RDI;
  uint in_R8D;
  RegMask filteredRegs;
  RATiedReg *tiedReg;
  RAWorkReg *workReg;
  char *in_stack_00000300;
  int in_stack_0000030c;
  char *in_stack_00000310;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined1 local_c4 [3];
  undefined3 in_stack_ffffffffffffff44;
  undefined4 uVar7;
  uint32_t local_ac;
  uint local_90 [4];
  RATiedReg *local_80;
  undefined1 *local_68;
  RAWorkReg *local_60;
  RAWorkReg *local_58;
  uint *local_50;
  undefined4 local_3c;
  RATiedReg *local_38;
  undefined4 local_2c;
  undefined4 local_28;
  undefined8 local_20;
  undefined4 local_14;
  RAWorkReg *local_10;
  
  group_00 = (RegGroup)((uint)in_ECX >> 0x18);
  uVar7 = CONCAT13(in_SIL,in_stack_ffffffffffffff44);
  if (in_R8D == 0) {
    DebugUtils::assertionFailed(in_stack_00000310,in_stack_0000030c,in_stack_00000300);
  }
  local_68 = local_c4;
  local_20 = *in_RDI;
  ppRVar5 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                      ((ZoneVector<asmjit::v1_14::RAWorkReg_*> *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),(size_t)in_RDI)
  ;
  pRVar1 = *ppRVar5;
  if (pRVar1[0x4a] != (RAWorkReg)0xff) {
    local_90[0] = (uint)(byte)pRVar1[0x4a];
    local_50 = local_90;
    if ((in_R8D & 1 << ((byte)pRVar1[0x4a] & 0x1f)) != 0) {
      return (uint)(byte)pRVar1[0x4a];
    }
  }
  pRVar6 = RAInst::tiedRegForWorkReg((RAInst *)CONCAT44(uVar7,in_EDX),group_00,in_R8D);
  if (pRVar6 != (RATiedReg *)0x0) {
    local_28 = 8;
    local_2c = 0x40000;
    local_3c = 0x40008;
    local_80 = pRVar6;
    local_38 = pRVar6;
    bVar3 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                      (pRVar6->_flags,kKill|kOut);
    if (bVar3) {
      uVar2 = 0;
      for (; (in_R8D & 1) == 0; in_R8D = in_R8D >> 1 | 0x80000000) {
        uVar2 = uVar2 + 1;
      }
      return uVar2;
    }
  }
  local_14 = 4;
  local_60 = pRVar1;
  local_10 = pRVar1;
  bVar3 = Support::test<asmjit::v1_14::RAWorkRegFlags,asmjit::v1_14::RAWorkRegFlags>
                    (*(RAWorkRegFlags *)(pRVar1 + 0x24),kMultipleBasicBlocks);
  if ((((bVar3 ^ 0xffU) & 1) == 0) ||
     (uVar4 = in_R8D & (*(uint *)(pRVar1 + 0x38) ^ 0xffffffff), uVar4 == 0)) {
    local_ac = 0xff;
  }
  else {
    local_58 = pRVar1;
    local_ac = pickBestSuitableRegister
                         ((RALocalAllocator *)CONCAT44(uVar4,in_stack_ffffffffffffff18),
                          (RegGroup)((ulong)in_RDI >> 0x38),(RegMask)in_RDI);
  }
  return local_ac;
}

Assistant:

uint32_t RALocalAllocator::decideOnReassignment(RegGroup group, uint32_t workId, uint32_t physId, RegMask allocableRegs, RAInst* raInst) const noexcept {
  ASMJIT_ASSERT(allocableRegs != 0);
  DebugUtils::unused(physId);

  RAWorkReg* workReg = workRegById(workId);

  // Prefer reassignment back to HomeId, if possible.
  if (workReg->hasHomeRegId()) {
    if (Support::bitTest(allocableRegs, workReg->homeRegId())) {
      return workReg->homeRegId();
    }
  }

  // Prefer assignment to a temporary register in case this register is killed by the instruction (or has an out slot).
  const RATiedReg* tiedReg = raInst->tiedRegForWorkReg(group, workId);
  if (tiedReg && tiedReg->isOutOrKill()) {
    return Support::ctz(allocableRegs);
  }

  // Prefer reassignment if this register is only used within a single basic block.
  if (workReg->isWithinSingleBasicBlock()) {
    RegMask filteredRegs = allocableRegs & ~workReg->clobberSurvivalMask();
    if (filteredRegs) {
      return pickBestSuitableRegister(group, filteredRegs);
    }
  }

  // TODO: [Register Allocator] This could be improved.

  // Decided to SPILL.
  return RAAssignment::kPhysNone;
}